

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

int set_paramptr(FILE *paramfile)

{
  rpf_t **pprVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  size_t sVar8;
  rpf_t *prVar9;
  undefined1 uVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *__s;
  int (*paiVar16) [16];
  double (*padVar17) [16];
  char *__s_00;
  long lVar18;
  undefined1 *__dest;
  bool bVar19;
  undefined1 uVar20;
  uint uVar21;
  char name [32];
  char value_str [100];
  char param_names [73] [20];
  variables_t variables [257];
  char variable_names [37] [20];
  char param_names1 [73] [24];
  char param_names0 [73] [24];
  size_t local_2768;
  uint local_2754;
  char *local_2748;
  char *local_2740;
  char local_2738 [32];
  char local_2718 [112];
  char local_26a8 [1472];
  long local_20e8 [438];
  OdometryPtr ap_Stack_1338 [3];
  double *local_1320;
  double *local_1310;
  double *local_1300;
  double *local_12f0;
  long alStack_12e0 [32];
  long alStack_11e0 [33];
  undefined1 local_10d8 [752];
  char local_de8 [1760];
  char local_708 [1752];
  
  pcVar12 = local_26a8;
  memcpy(pcVar12,"VERSION",0x5b4);
  memcpy(local_708,"VERSION",0x6d8);
  memcpy(local_de8,"VERSION",0x6d8);
  __dest = local_10d8;
  memcpy(__dest,&DAT_001162e0,0x2e4);
  padVar17 = g_P;
  lVar14 = 0;
  do {
    __s_00 = local_708 + lVar14;
    sVar8 = strlen(__s_00);
    builtin_strncpy(local_708 + sVar8 + lVar14,"[0]",4);
    __s = local_de8 + lVar14;
    sVar8 = strlen(__s);
    builtin_strncpy(local_de8 + sVar8 + lVar14,"[1]",4);
    *(char **)((long)local_20e8 + lVar14 * 2) = pcVar12;
    *(double (**) [16])((long)local_20e8 + lVar14 * 2 + 8) = padVar17;
    *(char **)((long)local_20e8 + lVar14 * 2 + 0x10) = __s_00;
    *(double (**) [16])((long)local_20e8 + lVar14 * 2 + 0x18) = padVar17;
    *(char **)((long)local_20e8 + lVar14 * 2 + 0x20) = __s;
    *(double **)((long)local_20e8 + lVar14 * 2 + 0x28) = *padVar17 + 1;
    lVar14 = lVar14 + 0x18;
    padVar17 = padVar17 + 1;
    pcVar12 = pcVar12 + 0x14;
  } while (lVar14 != 0x6d8);
  lVar14 = 0xdb0;
  do {
    *(undefined1 **)((long)local_20e8 + lVar14) = __dest;
    lVar14 = lVar14 + 0x10;
    __dest = __dest + 0x14;
  } while (lVar14 != 0x1000);
  lVar14 = 0;
  ap_Stack_1338[1] = get_odometry_ptr();
  local_1320 = &ap_Stack_1338[1]->y;
  local_1310 = &ap_Stack_1338[1]->theta;
  local_1300 = &ap_Stack_1338[1]->v;
  local_12f0 = &ap_Stack_1338[1]->w;
  do {
    *(long *)((long)alStack_12e0 + lVar14 * 2) = (long)ap_Stack_1338[1]->wvel + lVar14;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x80);
  lVar14 = 0;
  do {
    *(long *)((long)alStack_11e0 + lVar14 * 2) = (long)ap_Stack_1338[1]->wang + lVar14;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x80);
  alStack_11e0[0x1f] = 0;
  alStack_11e0[0x20] = 0;
  memset(g_P_changed,0,0x1240);
  if (g_param_init != 0) {
    g_param.motor_enable[0xc] = 0;
    g_param.motor_enable[0xd] = 0;
    g_param.motor_enable[0xe] = 0;
    g_param.motor_enable[0xf] = 0;
    g_param.motor_enable[8] = 0;
    g_param.motor_enable[9] = 0;
    g_param.motor_enable[10] = 0;
    g_param.motor_enable[0xb] = 0;
    g_param.motor_enable[4] = 0;
    g_param.motor_enable[5] = 0;
    g_param.motor_enable[6] = 0;
    g_param.motor_enable[7] = 0;
    g_param.motor_enable[0] = 0;
    g_param.motor_enable[1] = 0;
    g_param.motor_enable[2] = 0;
    g_param.motor_enable[3] = 0;
    lVar14 = 0;
    do {
      g_P_changed[3][lVar14] = 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x10);
    memset(g_P,0,0x2480);
    memset(g_P_set,0,0x1240);
    memset(g_Pf,0,0x2480);
  }
  uVar15 = 0x49;
  paiVar16 = g_P_set;
  local_2768 = 0;
  uVar20 = 0;
  local_2754 = 0;
  bVar4 = false;
LAB_0010c86e:
  uVar7 = getc((FILE *)paramfile);
  bVar19 = uVar7 == 0xffffffff;
  uVar21 = uVar7;
  if (bVar19) {
    uVar21 = 10;
  }
  cVar6 = (char)uVar21;
  iVar11 = (int)uVar15;
  switch(uVar20) {
  case 0:
    if ((((uVar21 & 0xffffffdf) - 0x41 < 0x1a) || (uVar20 = uVar21 == 0x23, uVar7 == 0x5f)) ||
       (uVar7 == 0x2d)) {
      uVar20 = 2;
      local_2768 = 1;
      local_2738[0] = cVar6;
    }
    break;
  case 1:
    uVar20 = uVar21 != 10;
    break;
  case 2:
    local_2738[(int)local_2768] = cVar6;
    if ((((uVar21 == 0x5f) || (0xffffffe5 < (uVar21 & 0xffffffdf) - 0x5b)) ||
        (uVar21 - 0x2d < 2 || uVar21 - 0x30 < 10)) ||
       ((uVar7 - 0x2d < 0x31 && ((0x1400000000001U >> ((ulong)(uVar7 - 0x2d) & 0x3f) & 1) != 0)))) {
      local_2768 = (size_t)((int)local_2768 + 1);
      uVar20 = 2;
    }
    else {
      local_2738[(int)local_2768] = '\0';
      uVar20 = 3;
      local_2768 = 0;
    }
    break;
  case 3:
    if (uVar21 - 0x3a < 0xfffffff6 && uVar21 - 0x2f < 0xfffffffe) {
      if (uVar21 == 0x3d) {
        strcpy(local_2718,local_2738);
        sVar8 = strlen(local_2718);
        (local_2718 + sVar8)[0] = '=';
        (local_2718 + sVar8)[1] = '\0';
        local_2768 = strlen(local_2718);
        uVar10 = 5;
        goto LAB_0010cb3c;
      }
      uVar10 = 3;
      bVar3 = true;
    }
    else {
      uVar10 = 4;
      local_2768 = 1;
      local_2718[0] = cVar6;
LAB_0010cb3c:
      bVar3 = false;
    }
    uVar20 = 3;
    if (bVar3) break;
    pcVar12 = strchr(local_2738,0x5b);
    if (pcVar12 == (char *)0x0) {
      local_2754 = 0xffffffff;
      local_2748 = (char *)0x0;
      local_2740 = (char *)0x0;
LAB_0010cce7:
      pcVar12 = local_26a8;
      uVar15 = 0;
      do {
        iVar11 = strcmp(local_2738,pcVar12);
        if (iVar11 == 0) {
          lVar14 = 0;
          goto LAB_0010cd20;
        }
        uVar15 = uVar15 + 1;
        pcVar12 = pcVar12 + 0x14;
      } while (uVar15 != 0x49);
      uVar15 = 0x49;
      goto LAB_0010cec8;
    }
    local_2740 = strchr(local_2738,0x5d);
    if (local_2740 != (char *)0x0) {
      local_2748 = pcVar12 + 1;
      *pcVar12 = '\0';
      *local_2740 = '\0';
      local_2754 = atoi(local_2748);
      goto LAB_0010cce7;
    }
    bVar5 = 0;
    yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2738);
    bVar4 = true;
    uVar15 = 0x49;
    uVar20 = 4;
    goto LAB_0010ceea;
  case 4:
    if (uVar21 - 0x2f < 0xfffffffe && uVar21 - 0x3a < 0xfffffff6) {
      local_2718[(int)local_2768] = '\0';
      if (iVar11 == 0x49) goto LAB_0010cad8;
      if (local_2754 == 0xffffffff) {
        lVar14 = (long)iVar11;
        lVar13 = 0;
        do {
          dVar2 = strtod(local_2718,(char **)0x0);
          *(double *)((long)g_P[lVar14] + lVar13 * 2) = dVar2;
          *(undefined4 *)((long)g_P_set[lVar14] + lVar13) = 1;
          *(undefined4 *)((long)g_P_changed[lVar14] + lVar13) = 1;
          if (*(long *)((long)g_Pf[lVar14] + lVar13 * 2) != 0) {
            formula_free();
            *(undefined8 *)((long)g_Pf[lVar14] + lVar13 * 2) = 0;
          }
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x40);
        yprintf(OUTPUT_LV_DEBUG,"%d %s %f\n",SUB84(g_P[lVar14][0],0),uVar15 & 0xffffffff,
                local_26a8 + lVar14 * 0x14);
      }
      else {
        dVar2 = strtod(local_2718,(char **)0x0);
        lVar14 = (long)iVar11;
        lVar13 = (long)(int)local_2754;
        g_P[lVar14][lVar13] = dVar2;
        g_P_set[lVar14][lVar13] = 1;
        g_P_changed[lVar14][lVar13] = 1;
        g_param.motor_enable[lVar13] = 1;
        if (g_Pf[lVar14][lVar13] != (rpf_t *)0x0) {
          formula_free();
          g_Pf[lVar14][lVar13] = (rpf_t *)0x0;
        }
        yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] %f\n",SUB84(g_P[lVar14][lVar13],0),uVar15 & 0xffffffff,
                local_26a8 + lVar14 * 0x14,(ulong)local_2754);
      }
LAB_0010d04e:
      local_2768 = 0;
      uVar20 = 0;
      uVar15 = 0x49;
    }
    else {
      local_2718[(int)local_2768] = cVar6;
      local_2768 = (size_t)((int)local_2768 + 1);
      uVar20 = 4;
    }
    break;
  case 5:
    if ((uVar21 == 0x23) || (uVar21 == 10)) {
      local_2718[(int)local_2768] = '\0';
      if (iVar11 != 0x49) {
        lVar14 = (long)iVar11;
        if (local_2754 == 0xffffffff) {
          lVar13 = lVar14 * 0x80;
          lVar18 = 0;
          do {
            *(undefined8 *)((long)g_P[0] + lVar13) = 0;
            g_P_set[lVar14][lVar18] = 1;
            if (*(long *)((long)g_Pf[0] + lVar13) != 0) {
              formula_free();
            }
            formula(local_2718,(long)g_Pf[0] + lVar13,local_20e8);
            lVar18 = lVar18 + 1;
            lVar13 = lVar13 + 8;
          } while (lVar18 != 0x10);
          if (g_Pf[lVar14][0] == (rpf_t *)0x0) {
            yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",local_2718);
            bVar4 = true;
          }
          else {
            lVar13 = 0;
            do {
              prVar9 = (rpf_t *)formula_optimize(g_Pf[lVar14][lVar13]);
              g_Pf[lVar14][lVar13] = prVar9;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0x10);
            yprintf(OUTPUT_LV_DEBUG,"%d %s ",uVar15 & 0xffffffff,local_26a8 + lVar14 * 0x14);
            if (OUTPUT_LV_INFO < g_param.output_lv) {
              formula_print(_stderr,g_Pf[lVar14][0]);
            }
            yprintf(OUTPUT_LV_DEBUG,"\n");
          }
        }
        else {
          lVar13 = (long)(int)local_2754;
          g_P[lVar14][lVar13] = 0.0;
          g_P_set[lVar14][lVar13] = 1;
          if (g_Pf[lVar14][lVar13] != (rpf_t *)0x0) {
            formula_free();
          }
          pprVar1 = g_Pf[lVar14] + lVar13;
          formula(local_2718,pprVar1,local_20e8);
          if (*pprVar1 == (rpf_t *)0x0) {
            yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",local_2718);
            bVar4 = true;
          }
          else {
            prVar9 = (rpf_t *)formula_optimize();
            *pprVar1 = prVar9;
            yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] ",uVar15 & 0xffffffff,local_26a8 + lVar14 * 0x14,
                    (ulong)local_2754);
            if (OUTPUT_LV_INFO < g_param.output_lv) {
              formula_print(_stderr,*pprVar1);
            }
            yprintf(OUTPUT_LV_DEBUG,"\n");
          }
        }
        goto LAB_0010d04e;
      }
LAB_0010cad8:
      local_2768 = 0;
      yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2738);
      bVar4 = true;
      uVar15 = 0x49;
      uVar20 = 0;
    }
    else {
      local_2718[(int)local_2768] = cVar6;
      local_2768 = (size_t)((int)local_2768 + 1);
      uVar20 = 5;
    }
  }
  goto switchD_0010c8a2_default;
  while (lVar14 = lVar14 + 0xc, lVar14 == 0xc) {
LAB_0010cd20:
    if (*(int *)((long)&DAT_001165d0 + lVar14) == (int)uVar15) {
      uVar15 = (ulong)*(uint *)(&UNK_001165d4 + lVar14);
      local_2754 = *(uint *)(&UNK_001165d8 + lVar14);
      yprintf(OUTPUT_LV_WARNING,"Parameter alias: %s -> %s[%d]\n",pcVar12,local_26a8 + uVar15 * 0x14
             );
      break;
    }
  }
LAB_0010cec8:
  bVar5 = 1;
  uVar20 = uVar10;
  if (local_2748 != (char *)0x0) {
    local_2748[-1] = '[';
    *local_2740 = ']';
  }
LAB_0010ceea:
  bVar19 = (bool)(uVar7 == 0xffffffff & bVar5);
switchD_0010c8a2_default:
  if (bVar19) {
    fclose((FILE *)paramfile);
    if (4.0 <= g_P[0][0]) {
      if (g_P[0][0] <= 5.0) {
        lVar14 = 0;
        do {
          uVar15 = 0;
          do {
            if (((g_param.motor_enable[uVar15] != 0) && ((&DAT_001161b0)[lVar14] != 0)) &&
               ((*paiVar16)[uVar15] == 0)) {
              yprintf(OUTPUT_LV_ERROR,"Error: %s[%d] undefined!\n",local_26a8 + lVar14 * 0x14,
                      uVar15 & 0xffffffff);
              bVar4 = true;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != 0x10);
          lVar14 = lVar14 + 1;
          paiVar16 = paiVar16 + 1;
        } while (lVar14 != 0x49);
        if (!bVar4) {
          g_param.num_motor_enable = 0;
          lVar14 = 0;
          iVar11 = 0;
          do {
            if (g_param.motor_enable[lVar14] != 0) {
              iVar11 = iVar11 + 1;
              g_param.num_motor_enable = iVar11;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          if (g_param.num_motor_enable == 0) {
            g_param.motor_enable[0] = 1;
            g_param.motor_enable[1] = 1;
            g_param.num_motor_enable = 2;
          }
          uVar15 = 0;
          do {
            if (g_param.motor_enable[uVar15] != 0) {
              if ((g_P_changed[0x40][uVar15] != 0) && (g_P_set[0x40][uVar15] != 0)) {
                if (g_P[0][0] < 5.0) {
                  yprintf(OUTPUT_LV_ERROR,
                          "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n"
                         );
                  return 0;
                }
                yprintf(OUTPUT_LV_WARNING,
                        "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n The behavior of this parameter may be changed in the future update.\n"
                       );
              }
              if (g_P_set[0x27][uVar15] == 0) {
                yprintf(OUTPUT_LV_WARNING,
                        "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n",
                        uVar15 & 0xffffffff,uVar15 & 0xffffffff);
                g_P[0x27][uVar15] = g_P[0x20][uVar15];
                g_P_changed[0x27][uVar15] = g_P_changed[0x20][uVar15];
              }
              if (g_P_set[0x3b][uVar15] == 0) {
                uVar21 = 0x3ff00000;
                if (1 < uVar15) {
                  uVar21 = 0;
                }
                if ((g_P[0x3b][uVar15] != (double)((ulong)uVar21 << 0x20)) ||
                   (NAN(g_P[0x3b][uVar15]) || NAN((double)((ulong)uVar21 << 0x20)))) {
                  g_P_changed[0x3b][uVar15] = 1;
                }
                g_P[0x3b][uVar15] = (double)((ulong)uVar21 << 0x20);
              }
              if (g_P_set[5][uVar15] == 0) {
                if ((g_P[5][uVar15] != 2.0) || (NAN(g_P[5][uVar15]))) {
                  g_P_changed[5][uVar15] = 1;
                }
                g_P[5][uVar15] = 2.0;
              }
              if (g_P_set[0x45][uVar15] == 0) {
                if ((g_P[0x45][uVar15] != 1.0) || (NAN(g_P[0x45][uVar15]))) {
                  g_P_changed[0x45][uVar15] = 1;
                }
                g_P[0x45][uVar15] = 1.0;
              }
              if (g_P_set[0x40][uVar15] == 0) {
                if ((g_P[0x40][uVar15] != 1.0) || (NAN(g_P[0x40][uVar15]))) {
                  g_P_changed[0x40][uVar15] = 1;
                }
                g_P[0x40][uVar15] = 1.0;
              }
              if (g_P_set[0x46][uVar15] == 0) {
                g_P[0x46][uVar15] = 0.3;
              }
              g_P[1][uVar15] = 1.0 / g_P[2][uVar15];
              g_P_changed[1][uVar15] = g_P_changed[2][uVar15];
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != 0x10);
          if (g_P_set[0x47][0] == 0) {
            g_P[0x47][0] = g_P[0x13][0];
            bVar4 = false;
          }
          else {
            bVar4 = false;
            if (g_P[0x47][0] <= 0.0) {
              yprintf(OUTPUT_LV_ERROR,"ERROR: MAX_TIME_JUMP must be > 0.0.\n");
              bVar4 = true;
            }
          }
          if (g_P_set[0x48][0] == 0) {
            g_P[0x48][0] = g_P[0x13][0];
          }
          else if (g_P[0x48][0] <= 0.0) {
            yprintf(OUTPUT_LV_ERROR,"ERROR: -MAX_TIME_JUMP must be > 0.0.\n");
            bVar4 = true;
          }
          if (!bVar4) {
            calc_param_inertia2ff();
            builtin_strncpy(g_state,"\x01\x01\x01\x01",4);
            yprintf(OUTPUT_LV_DEBUG,"Info: %d motors defined\n",
                    (ulong)(uint)g_param.num_motor_enable);
            return 1;
          }
        }
        return 0;
      }
      yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is unsupported!\n");
      yprintf(OUTPUT_LV_ERROR,"Error: Please install newer version of YP-Spur.\n");
      pcVar12 = "Error: This program supports %3.1f.\n";
    }
    else {
      yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is too old!\n");
      pcVar12 = "Error: This program requires %3.1f.\n";
    }
    yprintf(OUTPUT_LV_ERROR,pcVar12,0);
    return 0;
  }
  goto LAB_0010c86e;
}

Assistant:

int set_paramptr(FILE* paramfile)
{
  char param_names[YP_PARAM_NUM][20] = YP_PARAM_NAME;
  char param_names0[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  char param_names1[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  int param_necessary[YP_PARAM_NUM] = YP_PARAM_NECESSARY;
#define VARIABLE_NUM 37
  char variable_names[VARIABLE_NUM][20] =
      {
          "X",
          "Y",
          "THETA",
          "V",
          "W",
          "WHEEL_VEL[0]",
          "WHEEL_VEL[1]",
          "WHEEL_VEL[2]",
          "WHEEL_VEL[3]",
          "WHEEL_VEL[4]",
          "WHEEL_VEL[5]",
          "WHEEL_VEL[6]",
          "WHEEL_VEL[7]",
          "WHEEL_VEL[8]",
          "WHEEL_VEL[9]",
          "WHEEL_VEL[10]",
          "WHEEL_VEL[11]",
          "WHEEL_VEL[12]",
          "WHEEL_VEL[13]",
          "WHEEL_VEL[14]",
          "WHEEL_VEL[15]",
          "WHEEL_ANGLE[0]",
          "WHEEL_ANGLE[1]",
          "WHEEL_ANGLE[2]",
          "WHEEL_ANGLE[3]",
          "WHEEL_ANGLE[4]",
          "WHEEL_ANGLE[5]",
          "WHEEL_ANGLE[6]",
          "WHEEL_ANGLE[7]",
          "WHEEL_ANGLE[8]",
          "WHEEL_ANGLE[9]",
          "WHEEL_ANGLE[10]",
          "WHEEL_ANGLE[11]",
          "WHEEL_ANGLE[12]",
          "WHEEL_ANGLE[13]",
          "WHEEL_ANGLE[14]",
          "WHEEL_ANGLE[15]",
      };
  struct variables_t variables[YP_PARAM_NUM * 3 + 1 + VARIABLE_NUM];
  struct
  {
    YPSpur_param alias;
    YPSpur_param param;
    int motor;
  } param_alias[YP_PARAM_ALIAS_NUM] = YP_PARAM_ALIAS;
  char name[32], value_str[100];
  int i, j, c;
  int str_wp;
  int read_state;
  int param_num, motor_num;
  OdometryPtr odm;
  int param_error = 0;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    strcat(param_names0[i], "[0]");
    strcat(param_names1[i], "[1]");
    variables[i * 3 + 0].name = param_names[i];
    variables[i * 3 + 0].pointer = &g_P[i][0];
    variables[i * 3 + 1].name = param_names0[i];
    variables[i * 3 + 1].pointer = &g_P[i][0];
    variables[i * 3 + 2].name = param_names1[i];
    variables[i * 3 + 2].pointer = &g_P[i][1];
  }
  i = i * 3;
  for (j = 0; j < VARIABLE_NUM; j++)
  {
    variables[i + j].name = variable_names[j];
  }
  odm = get_odometry_ptr();
  variables[i++].pointer = &odm->x;
  variables[i++].pointer = &odm->y;
  variables[i++].pointer = &odm->theta;
  variables[i++].pointer = &odm->v;
  variables[i++].pointer = &odm->w;
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wvel[j];
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wang[j];
  variables[i].name = NULL;
  variables[i].pointer = NULL;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[i][j] = 0;
    }
  }
  if (g_param_init)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[YP_PARAM_PWM_MAX][j] = 1;
      g_param.motor_enable[j] = 0;
    }
    // パラメータの初期化
    for (i = 0; i < YP_PARAM_NUM; i++)
    {
      for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
      {
        g_P[i][j] = 0;
        g_P_set[i][j] = 0;
        g_Pf[i][j] = NULL;
      }
    }
  }

  // パラメータファイルの読み込み
  read_state = 0;
  str_wp = 0;
  motor_num = 0;
  param_num = YP_PARAM_NUM;
  while (1)
  {
    int eof = 0;

    c = getc(paramfile);
    if (c == EOF)
    {
      eof = 1;
      c = '\n';
    }

    switch (read_state)
    {
      case 0:
        /* - */
        if (c == '#')
        {
          read_state = 1;
        }
        if (is_character(c) || c == '-')
        {
          name[0] = c;
          read_state = 2;
          str_wp = 1;
        }
        break;
      case 1: /* comment */
        if (c == '\n')
        {
          read_state = 0;
        }
        break;
      case 2: /* name */
        name[str_wp] = c;
        if (!(is_character(c) || is_number(c) || c == '[' || c == ']' || c == '-'))
        {
          name[str_wp] = 0;
          read_state = 3;
          str_wp = 0;
        }
        else
        {
          str_wp++;
        }
        break;
      case 3: /* value */
        if (is_number(c))
        {
          str_wp = 0;
          value_str[str_wp] = c;
          str_wp++;
          read_state = 4;
        }
        else if (c == '=')
        {
          strcpy(value_str, name);
          strcat(value_str, "=");
          str_wp = strlen(value_str);
          read_state = 5;
        }
        if (read_state != 3)
        {
          char* num_start;
          char* num_end = NULL;
          int num;

          param_num = YP_PARAM_NUM;
          num = -1;

          num_start = strchr(name, '[');
          if (num_start)
          {
            num_start++;
            num_end = strchr(name, ']');
            if (!num_end)
            {
              read_state = 4;
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
              param_error = 1;
              continue;
            }
            *(num_start - 1) = 0;
            *num_end = 0;
            num = atoi(num_start);
          }
          motor_num = num;
          for (i = 0; i < YP_PARAM_NUM; i++)
          {
            if (!strcmp(name, param_names[i]))
            {
              int j;
              for (j = 0; j < YP_PARAM_ALIAS_NUM; j++)
              {
                if (i == param_alias[j].alias)
                {
                  yprintf(OUTPUT_LV_WARNING, "Parameter alias: %s -> %s[%d]\n",
                          param_names[i], param_names[param_alias[j].param], param_alias[j].motor);
                  i = param_alias[j].param;
                  motor_num = param_alias[j].motor;
                  break;
                }
              }
              param_num = i;
              break;
            }
          }
          if (num_start)
          {
            *(num_start - 1) = '[';
            *num_end = ']';
          }
        }
        break;
      case 4: /* value */
        if (!is_number(c))
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = strtod(value_str, 0);
              g_P_set[param_num][j] = 1;
              g_P_changed[param_num][j] = 1;
              if (g_Pf[param_num][j])
              {
                formula_free(g_Pf[param_num][j]);
                g_Pf[param_num][j] = NULL;
              }
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s %f\n", param_num, param_names[param_num], g_P[param_num][0]);
          }
          else
          {
            g_P[param_num][motor_num] = strtod(value_str, 0);
            g_P_set[param_num][motor_num] = 1;
            g_P_changed[param_num][motor_num] = 1;
            g_param.motor_enable[motor_num] = 1;
            if (g_Pf[param_num][motor_num])
            {
              formula_free(g_Pf[param_num][motor_num]);
              g_Pf[param_num][motor_num] = NULL;
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] %f\n", param_num, param_names[param_num], motor_num,
                    g_P[param_num][motor_num]);
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
      case 5: /* value */
        if (c == '#' || c == '\n')
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = 0;
              g_P_set[param_num][j] = 1;
              if (g_Pf[param_num][j])
                formula_free(g_Pf[param_num][j]);
              formula(value_str, &g_Pf[param_num][j], variables);
            }
            if (g_Pf[param_num][0] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
              {
                g_Pf[param_num][j] = formula_optimize(g_Pf[param_num][j]);
              }
              yprintf(OUTPUT_LV_DEBUG, "%d %s ", param_num, param_names[param_num]);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][0]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          else
          {
            g_P[param_num][motor_num] = 0;
            g_P_set[param_num][motor_num] = 1;
            if (g_Pf[param_num][motor_num])
              formula_free(g_Pf[param_num][motor_num]);
            formula(value_str, &g_Pf[param_num][motor_num], variables);
            if (g_Pf[param_num][motor_num] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              g_Pf[param_num][motor_num] = formula_optimize(g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] ", param_num, param_names[param_num], motor_num);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
    }
    if (eof)
      break;
  }

  fclose(paramfile);
  if (g_P[YP_PARAM_VERSION][0] < YP_PARAM_REQUIRED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is too old!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program requires %3.1f.\n", YP_PARAM_REQUIRED_VERSION);
    return 0;
  }
  if (g_P[YP_PARAM_VERSION][0] > YP_PARAM_SUPPORTED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is unsupported!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: Please install newer version of YP-Spur.\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program supports %3.1f.\n", YP_PARAM_SUPPORTED_VERSION);
    return 0;
  }

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (!g_param.motor_enable[j])
        continue;
      if (param_necessary[i] && !g_P_set[i][j])
      {
        yprintf(OUTPUT_LV_ERROR, "Error: %s[%d] undefined!\n", param_names[i], j);
        param_error = 1;
      }
    }
  }
  if (param_error)
  {
    return 0;
  }

  g_param.num_motor_enable = 0;
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    // Count motor number
    if (g_param.motor_enable[j])
      g_param.num_motor_enable++;
  }
  if (g_param.num_motor_enable == 0)
  {
    // If all parameters are common among motors, treat num_motor_enable as two
    g_param.motor_enable[0] = g_param.motor_enable[1] = 1;
    g_param.num_motor_enable = 2;
  }

  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;

    // Verify parameter version compatibility
    if (g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] &&
        g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_VERSION][0] < 5.0)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n"
            " Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n");
        return 0;
      }
      yprintf(
          OUTPUT_LV_WARNING,
          "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n"
          " The behavior of this parameter may be changed in the future update.\n");
    }

    // Check and fill undefined parameters
    if (!g_P_set[YP_PARAM_TORQUE_LIMIT][j])
    {
      yprintf(OUTPUT_LV_WARNING, "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n", j, j);
      g_P[YP_PARAM_TORQUE_LIMIT][j] = g_P[YP_PARAM_TORQUE_MAX][j];
      g_P_changed[YP_PARAM_TORQUE_LIMIT][j] = ischanged_p(YP_PARAM_TORQUE_MAX, j);
    }

    if (!g_P_set[YP_PARAM_VEHICLE_CONTROL][j])
    {
      double default_value;
      if (j < 2)
        default_value = 1.0;
      else
        default_value = 0.0;

      if (g_P[YP_PARAM_VEHICLE_CONTROL][j] != default_value)
        g_P_changed[YP_PARAM_VEHICLE_CONTROL][j] = 1;
      g_P[YP_PARAM_VEHICLE_CONTROL][j] = default_value;
    }

    if (!g_P_set[YP_PARAM_ENCODER_TYPE][j])
    {
      if (g_P[YP_PARAM_ENCODER_TYPE][j] != 2.0)
        g_P_changed[YP_PARAM_ENCODER_TYPE][j] = 1;
      g_P[YP_PARAM_ENCODER_TYPE][j] = 2.0;
    }
    if (!g_P_set[YP_PARAM_INDEX_GEAR][j])
    {
      if (g_P[YP_PARAM_INDEX_GEAR][j] != 1.0)
        g_P_changed[YP_PARAM_INDEX_GEAR][j] = 1;
      g_P[YP_PARAM_INDEX_GEAR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_ENCODER_DENOMINATOR][j] != 1.0)
        g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] = 1;
      g_P[YP_PARAM_ENCODER_DENOMINATOR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_DEVICE_TIMEOUT][j])
    {
      // YP_PARAM_DEVICE_TIMEOUT is always sent on reloading.
      // g_P_changed is not needed to be marked.
      g_P[YP_PARAM_DEVICE_TIMEOUT][j] = 0.3;
    }

    // Process internally calculated parameters
    g_P[YP_PARAM_TORQUE_UNIT][j] = 1.0 / g_P[YP_PARAM_TORQUE_FINENESS][j];
    g_P_changed[YP_PARAM_TORQUE_UNIT][j] = ischanged_p(YP_PARAM_TORQUE_FINENESS, j);
  }

  if (g_P_set[YP_PARAM_MAX_TIME_JUMP][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }
  if (g_P_set[YP_PARAM_MAX_TIME_JUMP_NEG][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: -MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }

  if (param_error)
  {
    return 0;
  }

  // パラメータの指定によって自動的に求まるパラメータの計算
  calc_param_inertia2ff();

  /* パラメータを有効にする */
  enable_state(YP_STATE_MOTOR);
  enable_state(YP_STATE_VELOCITY);
  enable_state(YP_STATE_BODY);
  enable_state(YP_STATE_TRACKING);

  yprintf(OUTPUT_LV_DEBUG, "Info: %d motors defined\n", g_param.num_motor_enable);

  return 1;
}